

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onEnterAssignStatementAstNode
          (SemanticAnalyzerRun *this,AssignStatementAstNode *node)

{
  string local_68;
  undefined1 local_48 [8];
  optional<VariableDefinition> originalDeclare;
  
  Scope::find((optional<VariableDefinition> *)local_48,
              (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              &((node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               value,false);
  if (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"No local declaration found for identifier.",
               (allocator<char> *)
               &originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                super__Optional_payload<VariableDefinition,_true,_false,_false>.
                super__Optional_payload_base<VariableDefinition>.field_0x1f);
    reportError(this,&node->identifier,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::_Optional_payload_base<VariableDefinition>::_M_reset
            ((_Optional_payload_base<VariableDefinition> *)local_48);
  return;
}

Assistant:

void onEnterAssignStatementAstNode(AssignStatementAstNode* node) noexcept override {
    auto originalDeclare = this->currentScope->find(node->identifier->value, false);
    if (originalDeclare == std::nullopt) {
      this->reportError(node->identifier, "No local declaration found for identifier.");
    }
  }